

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

void __thiscall QLayout::update(QLayout *this)

{
  undefined1 *puVar1;
  byte bVar2;
  QEvent *this_00;
  
  while( true ) {
    bVar2 = *(byte *)(*(long *)&this->field_0x8 + 0x8c);
    if ((bVar2 & 4) == 0) {
      return;
    }
    *(byte *)(*(long *)&this->field_0x8 + 0x8c) = bVar2 & 0xfb;
    puVar1 = &this->field_0x8;
    this = *(QLayout **)(*(long *)puVar1 + 0x10);
    if ((*(byte *)(*(long *)puVar1 + 0x8c) & 1) != 0) break;
    if (this == (QLayout *)0x0) {
      return;
    }
  }
  this_00 = (QEvent *)operator_new(0x10);
  QEvent::QEvent(this_00,LayoutRequest);
  QCoreApplication::postEvent(&this->super_QObject,this_00,0);
  return;
}

Assistant:

void QLayout::update()
{
    QLayout *layout = this;
    while (layout && layout->d_func()->activated) {
        layout->d_func()->activated = false;
        if (layout->d_func()->topLevel) {
            Q_ASSERT(layout->parent()->isWidgetType());
            QWidget *mw = static_cast<QWidget*>(layout->parent());
            QCoreApplication::postEvent(mw, new QEvent(QEvent::LayoutRequest));
            break;
        }
        layout = static_cast<QLayout*>(layout->parent());
    }
}